

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O0

void __thiscall pstore::broker::recorder::record(recorder *this,message_type *cmd)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  message_type *cmd_local;
  recorder *this_local;
  
  lock._8_8_ = cmd;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mut_);
  file::file_base::write<pstore::brokerface::message_type,void>
            (&(this->file_).super_file_base,(message_type *)lock._8_8_);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void recorder::record (brokerface::message_type const & cmd) {
            std::unique_lock<decltype (mut_)> const lock (mut_);
            file_.write (cmd);
        }